

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

bool __thiscall fast_float::bigint::shl_bits(bigint *this,size_t n)

{
  ushort uVar1;
  byte bVar2;
  ulong uVar3;
  limb lVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar2 = 0x40 - (byte)n;
  uVar1 = (this->vec).length;
  uVar3 = (ulong)uVar1;
  if (uVar3 == 0) {
    lVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    do {
      lVar4 = (this->vec).data[uVar6];
      (this->vec).data[uVar6] = uVar5 >> (bVar2 & 0x3f) | lVar4 << ((byte)n & 0x3f);
      uVar6 = uVar6 + 1;
      uVar5 = lVar4;
    } while (uVar3 != uVar6);
  }
  uVar5 = lVar4 >> (bVar2 & 0x3f);
  if (uVar5 == 0) {
    return true;
  }
  if (uVar1 < 0x3e) {
    (this->vec).data[uVar3] = uVar5;
    (this->vec).length = uVar1 + 1;
  }
  return uVar1 < 0x3e;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl_bits(size_t n) noexcept {
    // Internally, for each item, we shift left by n, and add the previous
    // right shifted limb-bits.
    // For example, we transform (for u8) shifted left 2, to:
    //      b10100100 b01000010
    //      b10 b10010001 b00001000
    FASTFLOAT_DEBUG_ASSERT(n != 0);
    FASTFLOAT_DEBUG_ASSERT(n < sizeof(limb) * 8);

    size_t shl = n;
    size_t shr = limb_bits - shl;
    limb prev = 0;
    for (size_t index = 0; index < vec.len(); index++) {
      limb xi = vec[index];
      vec[index] = (xi << shl) | (prev >> shr);
      prev = xi;
    }

    limb carry = prev >> shr;
    if (carry != 0) {
      return vec.try_push(carry);
    }
    return true;
  }